

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

void bt_skip_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
                 uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint32_t *puVar5;
  int iVar6;
  ulong uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  puVar5 = son + cyclic_pos * 2;
  puVar3 = son + (ulong)(cyclic_pos * 2) + 1;
  uVar4 = 0;
  uVar9 = 0;
  do {
    bVar11 = depth == 0;
    depth = depth - 1;
    if ((bVar11) || (uVar10 = pos - cur_match, cyclic_size <= uVar10)) {
      bVar11 = false;
      *puVar3 = 0;
      *puVar5 = 0;
    }
    else {
      uVar8 = 0;
      if (cyclic_pos < uVar10) {
        uVar8 = cyclic_size;
      }
      uVar1 = uVar9;
      if (uVar4 < uVar9) {
        uVar1 = uVar4;
      }
      uVar7 = (ulong)uVar1;
      puVar2 = son + (uVar8 + (cyclic_pos - uVar10)) * 2;
      if (cur[uVar7 - uVar10] == cur[uVar7]) {
        do {
          iVar6 = (int)uVar7;
          if (len_limit - 1 == iVar6) goto LAB_004fa301;
          uVar7 = (ulong)(iVar6 + 1);
        } while (cur[uVar7 - uVar10] == cur[uVar7]);
        if (len_limit - 1 == iVar6) {
LAB_004fa301:
          *puVar5 = *puVar2;
          *puVar3 = puVar2[1];
          bVar11 = false;
          goto LAB_004fa34f;
        }
      }
      if (cur[uVar7 - uVar10] < cur[uVar7]) {
        *puVar5 = cur_match;
        puVar5 = puVar2 + 1;
        puVar2 = puVar3;
        puVar3 = puVar5;
        uVar9 = (uint)uVar7;
      }
      else {
        *puVar3 = cur_match;
        puVar3 = puVar2;
        uVar4 = (uint)uVar7;
      }
      cur_match = *puVar3;
      bVar11 = true;
      puVar3 = puVar2;
    }
LAB_004fa34f:
    if (!bVar11) {
      return;
    }
  } while( true );
}

Assistant:

static void
bt_skip_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		uint32_t *pair;
		const uint8_t *pb;
		uint32_t len;

		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return;
		}

		pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);
		pb = cur - delta;
		len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len == len_limit) {
				*ptr1 = pair[0];
				*ptr0 = pair[1];
				return;
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}